

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O2

string * ConnectionTypeAsString_abi_cxx11_(string *__return_storage_ptr__,ConnectionType conn_type)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(conn_type) {
  case INBOUND:
    __s = "inbound";
    __a = &local_11;
    break;
  case OUTBOUND_FULL_RELAY:
    __s = "outbound-full-relay";
    __a = &local_14;
    break;
  case MANUAL:
    __s = "manual";
    __a = &local_12;
    break;
  case FEELER:
    __s = "feeler";
    __a = &local_13;
    break;
  case BLOCK_RELAY:
    __s = "block-relay-only";
    __a = &local_15;
    break;
  case ADDR_FETCH:
    __s = "addr-fetch";
    __a = &local_16;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/connection_types.cpp"
                  ,0x19,"std::string ConnectionTypeAsString(ConnectionType)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConnectionTypeAsString(ConnectionType conn_type)
{
    switch (conn_type) {
    case ConnectionType::INBOUND:
        return "inbound";
    case ConnectionType::MANUAL:
        return "manual";
    case ConnectionType::FEELER:
        return "feeler";
    case ConnectionType::OUTBOUND_FULL_RELAY:
        return "outbound-full-relay";
    case ConnectionType::BLOCK_RELAY:
        return "block-relay-only";
    case ConnectionType::ADDR_FETCH:
        return "addr-fetch";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}